

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

Sphere __thiscall rw::MorphTarget::calculateBoundingSphere(MorphTarget *this)

{
  Sphere SVar1;
  float32 fVar2;
  V3d VVar3;
  V3d *local_a0;
  float32 local_98;
  MorphTarget *local_80;
  float32 local_78;
  V3d local_70;
  V3d local_60;
  MorphTarget *local_50;
  float32 local_48;
  int local_44;
  V3d *pVStack_40;
  int32 j;
  V3d *v;
  V3d max;
  V3d min;
  MorphTarget *this_local;
  Sphere sphere;
  
  max.y = 1e+06;
  max.z = 1e+06;
  min.x = 1e+06;
  v = (V3d *)0xc9742400c9742400;
  max.x = -1e+06;
  pVStack_40 = this->vertices;
  for (local_44 = 0; local_44 < this->parent->numVertices; local_44 = local_44 + 1) {
    if (v._0_4_ < (float)pVStack_40->x) {
      v = (V3d *)CONCAT44(v._4_4_,pVStack_40->x);
    }
    if ((float)pVStack_40->x < (float)max.y) {
      max.y = pVStack_40->x;
    }
    if (v._4_4_ < (float)pVStack_40->y) {
      v = (V3d *)CONCAT44(pVStack_40->y,v._0_4_);
    }
    if ((float)pVStack_40->y < (float)max.z) {
      max.z = pVStack_40->y;
    }
    if ((float)max.x < (float)pVStack_40->z) {
      max.x = pVStack_40->z;
    }
    if ((float)pVStack_40->z < (float)min.x) {
      min.x = pVStack_40->z;
    }
    pVStack_40 = pVStack_40 + 1;
  }
  VVar3 = add((V3d *)&max.y,(V3d *)&v);
  local_70.z = VVar3.z;
  local_60.z = local_70.z;
  local_70._0_8_ = VVar3._0_8_;
  local_60.x = local_70.x;
  local_60.y = local_70.y;
  VVar3 = scale(&local_60,0.5);
  local_78 = VVar3.z;
  local_48 = local_78;
  local_80 = VVar3._0_8_;
  local_50 = local_80;
  sphere.center.x = local_78;
  this_local = local_80;
  VVar3 = sub((V3d *)&v,(V3d *)&this_local);
  local_98 = VVar3.z;
  local_a0 = VVar3._0_8_;
  max.x = local_98;
  v = local_a0;
  fVar2 = rw::length((V3d *)&v);
  SVar1.center.z = sphere.center.x;
  SVar1.center._0_8_ = this_local;
  SVar1.radius = fVar2;
  return SVar1;
}

Assistant:

Sphere
MorphTarget::calculateBoundingSphere(void) const
{
	Sphere sphere;
	V3d min = {  1000000.0f,  1000000.0f,  1000000.0f };
	V3d max = { -1000000.0f, -1000000.0f, -1000000.0f };
	V3d *v = this->vertices;
	for(int32 j = 0; j < this->parent->numVertices; j++){
		if(v->x > max.x) max.x = v->x;
		if(v->x < min.x) min.x = v->x;
		if(v->y > max.y) max.y = v->y;
		if(v->y < min.y) min.y = v->y;
		if(v->z > max.z) max.z = v->z;
		if(v->z < min.z) min.z = v->z;
		v++;
	}
	sphere.center = scale(add(min, max), 1/2.0f);
	max = sub(max, sphere.center);
	sphere.radius = length(max);
	return sphere;
}